

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ResizeAndRehash_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeAndRehash_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  size_type sVar2;
  char *lhs_expression;
  AssertHelper *this_00;
  AssertionResult gtest_ar_2;
  int i_1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i;
  TypeParam ht;
  size_type in_stack_fffffffffffffde8;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  value_type in_stack_fffffffffffffdfc;
  allocator_type *in_stack_fffffffffffffe00;
  key_equal *in_stack_fffffffffffffe08;
  int iVar3;
  hasher *in_stack_fffffffffffffe10;
  size_type in_stack_fffffffffffffe18;
  Type type;
  undefined4 in_stack_fffffffffffffe20;
  value_type in_stack_fffffffffffffe24;
  Message *in_stack_fffffffffffffe68;
  AssertHelper *message;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe70;
  int local_154;
  AssertionResult local_130 [2];
  undefined4 local_10c;
  size_type local_108;
  AssertionResult local_100 [3];
  value_type local_c4;
  int local_c0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b0;
  Hasher local_a0;
  Hasher local_94 [12];
  
  Hasher::Hasher(local_94,0);
  Hasher::Hasher(&local_a0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_b0,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             in_stack_fffffffffffffe00);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_b0);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::max_load_factor((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffffdf0,(float)(in_stack_fffffffffffffde8 >> 0x20));
  for (local_c0 = 1; local_c0 < 100; local_c0 = local_c0 + 1) {
    in_stack_fffffffffffffe24 =
         HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject(in_stack_fffffffffffffdf0,(int)(in_stack_fffffffffffffde8 >> 0x20));
    local_c4 = in_stack_fffffffffffffe24;
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffe70,(value_type *)in_stack_fffffffffffffe68);
  }
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::resize((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  sVar2 = google::
          BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)0xcdc2a7);
  local_10c = 300;
  local_108 = sVar2;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_int>
            ((char *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
             (uint *)in_stack_fffffffffffffdf0);
  iVar3 = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_100);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    in_stack_fffffffffffffe10 =
         (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0xcdc327);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (Type)(sVar2 >> 0x20),(char *)in_stack_fffffffffffffe10,iVar3,
               (char *)in_stack_fffffffffffffe00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdf0);
    testing::Message::~Message((Message *)0xcdc384);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xcdc3f5);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::rehash((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  lhs_expression =
       (char *)google::
               BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)0xcdc421);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (lhs_expression,(char *)in_stack_fffffffffffffe00,
             (uint *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
             (unsigned_long *)in_stack_fffffffffffffdf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    in_stack_fffffffffffffe00 =
         (allocator_type *)testing::AssertionResult::failure_message((AssertionResult *)0xcdc4a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (Type)(sVar2 >> 0x20),(char *)in_stack_fffffffffffffe10,
               (int)((ulong)lhs_expression >> 0x20),(char *)in_stack_fffffffffffffe00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdf0);
    testing::Message::~Message((Message *)0xcdc505);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xcdc573);
  for (local_154 = 0x65; type = (Type)(sVar2 >> 0x20), local_154 < 200; local_154 = local_154 + 1) {
    in_stack_fffffffffffffdfc =
         HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject(in_stack_fffffffffffffdf0,(int)(in_stack_fffffffffffffde8 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffe70,(value_type *)in_stack_fffffffffffffe68);
  }
  this_00 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xcdc600);
  message = this_00;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            (lhs_expression,(char *)in_stack_fffffffffffffe00,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
             (uint *)this_00);
  iVar3 = (int)((ulong)lhs_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffe70);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    testing::AssertionResult::failure_message((AssertionResult *)0xcdc677);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),type,
               (char *)in_stack_fffffffffffffe10,iVar3,(char *)in_stack_fffffffffffffe00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffe70,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0xcdc6c3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xcdc728);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xcdc735);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeAndRehash) {
  // resize() and rehash() are synonyms.  rehash() is the tr1 name.
  TypeParam ht(10000);
  ht.max_load_factor(0.8f);  // for consistency's sake

  for (int i = 1; i < 100; ++i) ht.insert(this->UniqueObject(i));
  ht.resize(0);
  // Now ht should be as small as possible.
  EXPECT_LT(ht.bucket_count(), 300u);

  ht.rehash(9000);  // use the 'rehash' version of the name.
  // Bucket count should be next power of 2, after considering max_load_factor.
  EXPECT_EQ(16384u, ht.bucket_count());
  for (int i = 101; i < 200; ++i) ht.insert(this->UniqueObject(i));
  // Adding a few hundred buckets shouldn't have caused a resize yet.
  EXPECT_EQ(ht.bucket_count(), 16384u);
}